

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *color;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uchar *puVar9;
  void *__ptr;
  long lVar10;
  ulong uVar11;
  uchar *out_00;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  size_t bytewidth;
  byte bVar17;
  uint uVar18;
  bool bVar19;
  ulong local_290;
  ulong local_250;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t local_138 [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  color = &info_png->color;
  uVar8 = (info_png->color).bitdepth;
  uVar6 = getNumColorChannels((info_png->color).colortype);
  uVar6 = uVar6 * uVar8;
  if (info_png->interlace_method == 0) {
    uVar7 = uVar6 * w;
    uVar18 = (uVar7 + 7 >> 3) * h;
    uVar15 = h + uVar18;
    *outsize = (ulong)uVar15;
    puVar9 = (uchar *)malloc((ulong)uVar15);
    *out = puVar9;
    uVar8 = (uint)CONCAT71((int7)((ulong)out >> 8),puVar9 == (uchar *)0x0);
    if (uVar15 == 0 || puVar9 != (uchar *)0x0) {
      if ((uVar6 < 8) && (uVar8 = uVar7 + 7 & 0xfffffff8, uVar7 != uVar8)) {
        out_00 = (uchar *)malloc((ulong)uVar18);
        if (out_00 != (uchar *)0x0) {
          addPaddingBits(out_00,in,(ulong)uVar8,(ulong)uVar7,h);
          filter(puVar9,out_00,w,h,color,settings);
        }
        free(out_00);
        return extraout_EAX_00;
      }
      uVar8 = filter(puVar9,in,w,h,color,settings);
      return uVar8;
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar6);
    *outsize = filter_passstart[7];
    puVar9 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar9;
    __ptr = malloc(passstart[7]);
    if ((puVar9 != (uchar *)0x0) && (passstart[7] == 0 || __ptr != (void *)0x0)) {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_138,w,h,uVar6)
      ;
      if (uVar6 < 8) {
        lVar10 = 0;
        do {
          uVar8 = passh_1[lVar10];
          if (uVar8 != 0) {
            uVar7 = passw_1[lVar10];
            uVar18 = 0;
            do {
              if ((ulong)uVar7 != 0) {
                uVar15 = ADAM7_DY[lVar10];
                uVar2 = ADAM7_IY[lVar10];
                uVar3 = ADAM7_DX[lVar10];
                sVar5 = local_138[lVar10];
                uVar4 = ADAM7_IX[lVar10];
                uVar13 = 0;
                do {
                  if (uVar6 != 0) {
                    uVar12 = (ulong)((uVar7 * uVar18 + (int)uVar13) * uVar6) + sVar5 * 8;
                    uVar11 = (ulong)((uVar3 * (int)uVar13 + (uVar15 * uVar18 + uVar2) * w + uVar4) *
                                    uVar6);
                    uVar14 = uVar6;
                    do {
                      bVar17 = '\x01' << (~(byte)uVar12 & 7);
                      if ((in[uVar11 >> 3] >> (~(byte)uVar11 & 7) & 1) == 0) {
                        pbVar1 = (byte *)((long)__ptr + (uVar12 >> 3));
                        *pbVar1 = *pbVar1 & ~bVar17;
                      }
                      else {
                        pbVar1 = (byte *)((long)__ptr + (uVar12 >> 3));
                        *pbVar1 = *pbVar1 | bVar17;
                      }
                      uVar12 = uVar12 + 1;
                      uVar11 = uVar11 + 1;
                      uVar14 = uVar14 - 1;
                    } while (uVar14 != 0);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar7);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar8);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 7);
      }
      else {
        uVar13 = (ulong)(uVar6 >> 3);
        lVar10 = 0;
        do {
          uVar8 = passh_1[lVar10];
          if ((ulong)uVar8 != 0) {
            uVar11 = (ulong)passw_1[lVar10];
            local_250 = 0;
            local_290 = 0;
            do {
              if (uVar11 != 0) {
                uVar7 = ADAM7_DX[lVar10];
                sVar5 = local_138[lVar10];
                uVar18 = (ADAM7_DY[lVar10] * (int)local_290 + ADAM7_IY[lVar10]) * w +
                         ADAM7_IX[lVar10];
                uVar12 = uVar11;
                uVar16 = local_250;
                do {
                  memcpy((void *)((long)__ptr + (uVar16 & 0xffffffff) * uVar13 + sVar5),
                         in + uVar18 * uVar13,uVar13);
                  uVar18 = uVar18 + uVar7;
                  uVar16 = uVar16 + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              local_290 = local_290 + 1;
              local_250 = local_250 + uVar11;
            } while (local_290 != uVar8);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 7);
      }
      lVar10 = 0;
      do {
        if (uVar6 < 8) {
          puVar9 = (uchar *)malloc(*(long *)((long)padded_passstart + lVar10 * 2 + 8) -
                                   *(long *)((long)padded_passstart + lVar10 * 2));
          if (puVar9 == (uchar *)0x0) break;
          uVar8 = *(uint *)((long)passw + lVar10);
          uVar18 = uVar8 * uVar6;
          uVar7 = *(uint *)((long)passh + lVar10);
          addPaddingBits(puVar9,(uchar *)(*(long *)((long)passstart + lVar10 * 2) + (long)__ptr),
                         (ulong)(uVar18 + 7 & 0xfffffff8),(ulong)uVar18,uVar7);
          uVar8 = filter(*out + *(long *)((long)filter_passstart + lVar10 * 2),puVar9,uVar8,uVar7,
                         color,settings);
          free(puVar9);
        }
        else {
          uVar8 = filter(*out + *(long *)((long)filter_passstart + lVar10 * 2),
                         (uchar *)(*(long *)((long)padded_passstart + lVar10 * 2) + (long)__ptr),
                         *(uint *)((long)passw + lVar10),*(uint *)((long)passh + lVar10),color,
                         settings);
        }
        if ((uVar8 != 0) || (bVar19 = lVar10 == 0x18, lVar10 = lVar10 + 4, bVar19)) break;
      } while( true );
    }
    free(__ptr);
    uVar8 = extraout_EAX;
  }
  return uVar8;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
  unsigned w, unsigned h,
  const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if (info_png->interlace_method == 0) {
    *outsize = h + (h * ((w * bpp + 7u) / 8u)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if (!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if (!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if (bpp < 8 && w * bpp != ((w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if (!padded) error = 83; /*alloc fail*/
        if (!error) {
          addPaddingBits(padded, in, ((w * bpp + 7u) / 8u) * 8u, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      }
      else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  }
  else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if (!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if (!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if (!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for (i = 0; i != 7; ++i) {
        if (bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if (!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
            ((passw[i] * bpp + 7u) / 8u) * 8u, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
            passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        }
        else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
            passw[i], passh[i], &info_png->color, settings);
        }

        if (error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}